

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O2

void __thiscall
chrono::ChConveyor::ChConveyor(ChConveyor *this,double xlength,double ythick,double zwidth)

{
  ChBody *pCVar1;
  ChLinkLockLock *this_00;
  ChMarker *pCVar2;
  shared_ptr<chrono::ChMarker> mmark2;
  shared_ptr<chrono::ChMarker> mmark1;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_48;
  shared_ptr<chrono::ChFunction> local_38;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChConveyor_0115c600;
  this->conveyor_speed = 1.0;
  (this->conveyor_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->conveyor_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCVar1 = (ChBody *)Eigen::internal::aligned_malloc(0x360);
  ChBody::ChBody(pCVar1,BULLET);
  this->conveyor_truss = pCVar1;
  pCVar1 = (ChBody *)Eigen::internal::aligned_malloc(0x360);
  ChBody::ChBody(pCVar1,BULLET);
  this->conveyor_plate = pCVar1;
  std::make_shared<chrono::ChMaterialSurfaceNSC>();
  std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)
             &this->conveyor_mat,
             (__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2> *)&mmark1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &mmark1,&(this->conveyor_plate->collision_model).
                      super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
            );
  (*((mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ChObj).
    _vptr_ChObj[3])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->conveyor_plate->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &(this->conveyor_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&mmark1,1.0);
  (*(local_48._M_ptr)->_vptr_ChCollisionModel[7])
            (xlength * 0.5,ythick * 0.5,zwidth * 0.5,local_48._M_ptr,&local_78,&mmark2,&mmark1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &mmark1,&(this->conveyor_plate->collision_model).
                      super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
            );
  (*((mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ChObj).
    _vptr_ChObj[4])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ChBody::SetCollide(this->conveyor_plate,true);
  this_00 = (ChLinkLockLock *)Eigen::internal::aligned_malloc(0x1060);
  ChLinkLockLock::ChLinkLockLock(this_00);
  this->internal_link = this_00;
  std::make_shared<chrono::ChFunction_Ramp>();
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ChLinkLockLock::SetMotion_X(this_00,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pCVar2 = (ChMarker *)Eigen::internal::aligned_malloc(0x340);
  ChMarker::ChMarker(pCVar2);
  std::__shared_ptr<chrono::ChMarker,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChMarker,void>
            ((__shared_ptr<chrono::ChMarker,(__gnu_cxx::_Lock_policy)2> *)&mmark1,pCVar2);
  pCVar2 = (ChMarker *)Eigen::internal::aligned_malloc(0x340);
  ChMarker::ChMarker(pCVar2);
  std::__shared_ptr<chrono::ChMarker,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChMarker,void>
            ((__shared_ptr<chrono::ChMarker,(__gnu_cxx::_Lock_policy)2> *)&mmark2,pCVar2);
  pCVar1 = this->conveyor_truss;
  std::__shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>);
  ChBody::AddMarker(pCVar1,(shared_ptr<chrono::ChMarker> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  pCVar1 = this->conveyor_plate;
  std::__shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,&mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>);
  ChBody::AddMarker(pCVar1,(shared_ptr<chrono::ChMarker> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  ChLinkMarkers::ReferenceMarkers
            ((ChLinkMarkers *)this->internal_link,
             mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ChConveyor::ChConveyor(double xlength, double ythick, double zwidth) : conveyor_speed(1) {
    conveyor_truss = new ChBody;
    conveyor_plate = new ChBody;

    conveyor_mat = chrono_types::make_shared<ChMaterialSurfaceNSC>();

    conveyor_plate->GetCollisionModel()->ClearModel();
    conveyor_plate->GetCollisionModel()->AddBox(conveyor_mat, xlength * 0.5, ythick * 0.5, zwidth * 0.5);
    conveyor_plate->GetCollisionModel()->BuildModel();
    conveyor_plate->SetCollide(true);

    internal_link = new ChLinkLockLock;
    internal_link->SetMotion_X(chrono_types::make_shared<ChFunction_Ramp>());

    std::shared_ptr<ChMarker> mmark1(new ChMarker);
    std::shared_ptr<ChMarker> mmark2(new ChMarker);
    conveyor_truss->AddMarker(mmark1);
    conveyor_plate->AddMarker(mmark2);

    internal_link->ReferenceMarkers(mmark1.get(), mmark2.get());
}